

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O2

bool __thiscall
bloaty::RangeMap::AddRangeWithTranslation
          (RangeMap *this,uint64_t addr,uint64_t size,string *val,RangeMap *translator,bool verbose,
          RangeMap *other)

{
  Map *pMVar1;
  bool bVar2;
  const_iterator iter;
  uint64_t uVar3;
  ulong uVar4;
  uint64_t trimmed_size;
  uint64_t translated_addr;
  uint64_t trimmed_addr;
  uint64_t local_60;
  RangeMap *local_58;
  uint64_t local_50;
  RangeMap *local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  local_58 = translator;
  local_48 = this;
  iter = FindContaining(translator,addr);
  local_40 = addr;
  if (size == 0xffffffffffffffff) {
    uVar4 = addr + 1;
  }
  else {
    uVar4 = size + addr;
    if (CARRY8(size,addr)) {
      __assert_fail("end >= addr",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                    ,0x108,
                    "bool bloaty::RangeMap::AddRangeWithTranslation(uint64_t, uint64_t, const std::string &, const RangeMap &, bool, RangeMap *)"
                   );
    }
  }
  pMVar1 = &local_58->mappings_;
  uVar3 = 0;
  for (; (&(pMVar1->_M_t)._M_impl.super__Rb_tree_header != (_Rb_tree_header *)iter._M_node &&
         (*(ulong *)(iter._M_node + 1) < uVar4));
      iter._M_node = (_Base_ptr)std::_Rb_tree_increment(iter._M_node)) {
    bVar2 = TranslateAndTrimRangeWithEntry<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                      (local_58,(_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                                 )iter._M_node,local_40,size,&local_38,&local_50,&local_60);
    if (bVar2) {
      if (verbose || 2 < verbose_level) {
        printf("  -> translates to: [%lx %lx]\n",local_50,local_60);
      }
      AddRange(other,local_50,local_60,val);
    }
    AddRange(local_48,local_38,local_60,val);
    uVar3 = uVar3 + local_60;
  }
  return uVar3 == size;
}

Assistant:

bool RangeMap::AddRangeWithTranslation(uint64_t addr, uint64_t size,
                                       const std::string& val,
                                       const RangeMap& translator,
                                       bool verbose,
                                       RangeMap* other) {
  auto it = translator.FindContaining(addr);
  uint64_t end;
  if (size == kUnknownSize) {
    end = addr + 1;
  } else {
    end = addr + size;
    assert(end >= addr);
  }
  uint64_t total_size = 0;

  // TODO: optionally warn about when we span ranges of the translator.  In some
  // cases this would be a bug (ie. symbols VM->file).  In other cases it's
  // totally normal (ie. archive members file->VM).
  while (!translator.IterIsEnd(it) && it->first < end) {
    uint64_t translated_addr;
    uint64_t trimmed_addr;
    uint64_t trimmed_size;
    if (translator.TranslateAndTrimRangeWithEntry(
            it, addr, size, &trimmed_addr, &translated_addr, &trimmed_size)) {
      if (verbose_level > 2 || verbose) {
        printf("  -> translates to: [%" PRIx64 " %" PRIx64 "]\n", translated_addr,
               trimmed_size);
      }
      other->AddRange(translated_addr, trimmed_size, val);
    }
    AddRange(trimmed_addr, trimmed_size, val);
    total_size += trimmed_size;
    ++it;
  }

  return total_size == size;
}